

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_5::RepeatedVarint_Int32_Test::TestBody
          (RepeatedVarint_Int32_Test *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference piVar4;
  size_t sVar5;
  char *message;
  AssertHelper local_70;
  Message local_68;
  size_t local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  unsigned_long uStack_40;
  int i;
  size_t expected;
  int local_24;
  undefined1 local_20 [4];
  int n;
  RepeatedField<int> v;
  RepeatedVarint_Int32_Test *this_local;
  
  v.soo_rep_.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)this;
  RepeatedField<int>::RepeatedField((RepeatedField<int> *)local_20);
  for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
    RepeatedField<int>::Add((RepeatedField<int> *)local_20,-(1 << ((byte)local_24 & 0x1f)));
    RepeatedField<int>::Add((RepeatedField<int> *)local_20,1 << ((byte)local_24 & 0x1f));
    RepeatedField<int>::Add((RepeatedField<int> *)local_20,(1 << ((byte)local_24 & 0x1f)) + -1);
  }
  uStack_40 = 0;
  for (gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      iVar1 = gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_, iVar3 = RepeatedField<int>::size((RepeatedField<int> *)local_20),
      iVar1 < iVar3;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    piVar4 = RepeatedField<int>::operator[]
                       ((RepeatedField<int> *)local_20,
                        gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_);
    sVar5 = WireFormatLite::Int32Size(*piVar4);
    uStack_40 = sVar5 + uStack_40;
  }
  local_60 = WireFormatLite::Int32Size((RepeatedField<int> *)local_20);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_58,"expected","WireFormatLite::Int32Size(v)",&stack0xffffffffffffffc0
             ,&local_60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar2) {
    testing::Message::Message(&local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.cc"
               ,0x36,message);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  RepeatedField<int>::~RepeatedField((RepeatedField<int> *)local_20);
  return;
}

Assistant:

TEST(RepeatedVarint, Int32) {
  RepeatedField<int32_t> v;

  // Insert -2^n, 2^n and 2^n-1.
  for (int n = 0; n < 10; n++) {
    v.Add(-(1 << n));
    v.Add(1 << n);
    v.Add((1 << n) - 1);
  }

  // Check consistency with the scalar Int32Size.
  size_t expected = 0;
  for (int i = 0; i < v.size(); i++) {
    expected += WireFormatLite::Int32Size(v[i]);
  }

  EXPECT_EQ(expected, WireFormatLite::Int32Size(v));
}